

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpthreaddelegate_p.cpp
# Opt level: O0

void QHttpThreadDelegate::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QMetaType QVar2;
  QtMocHelpers *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QHttpThreadDelegate *_t;
  QHttpThreadDelegate *in_stack_fffffffffffffd48;
  QHttpThreadDelegate *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd58;
  NetworkError in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  QHttpThreadDelegate *in_stack_fffffffffffffd68;
  QHttpThreadDelegate *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd88;
  undefined3 in_stack_fffffffffffffd8c;
  undefined4 uVar3;
  QHttpThreadDelegate *in_stack_fffffffffffffd98;
  QHttpHeaders *_t1;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 uVar4;
  undefined8 uVar5;
  qint64 in_stack_fffffffffffffdc0;
  qint64 in_stack_fffffffffffffdc8;
  QHttpThreadDelegate *in_stack_fffffffffffffe00;
  QMetaType local_140;
  QMetaTypeInterface *local_138;
  QMetaType local_130;
  QMetaTypeInterface *local_128;
  QMetaType local_120;
  QMetaTypeInterface *local_118;
  QMetaType local_110;
  QMetaTypeInterface *local_108;
  QMetaType local_100;
  QMetaTypeInterface *local_f8;
  QMetaType local_f0;
  QMetaTypeInterface *local_e8;
  QMetaType local_e0;
  QMetaTypeInterface *local_d8;
  QMetaType local_d0;
  QMetaTypeInterface *local_c8;
  QMetaType local_c0;
  QMetaTypeInterface *local_b8;
  QMetaType local_b0;
  QMetaTypeInterface *local_a8;
  QMetaType local_a0;
  QMetaTypeInterface *local_98;
  QMetaType local_90;
  QMetaTypeInterface *local_88;
  QMetaType local_80;
  QMetaTypeInterface *local_78;
  QMetaType local_70;
  QMetaTypeInterface *local_68;
  QMetaType local_60;
  QMetaType local_58 [9];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      authenticationRequired
                (in_stack_fffffffffffffd50,(QHttpNetworkRequest *)in_stack_fffffffffffffd48,
                 (QAuthenticator *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      break;
    case 1:
      proxyAuthenticationRequired
                (in_stack_fffffffffffffd50,(QNetworkProxy *)in_stack_fffffffffffffd48,
                 (QAuthenticator *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      break;
    case 2:
      encrypted((QHttpThreadDelegate *)0x310c0c);
      break;
    case 3:
      sslErrors((QHttpThreadDelegate *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)
                ,(QList<QSslError> *)in_stack_fffffffffffffd50,(bool *)in_stack_fffffffffffffd68,
                (QList<QSslError> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      break;
    case 4:
      sslConfigurationChanged
                (in_stack_fffffffffffffd50,(QSslConfiguration *)in_stack_fffffffffffffd48);
      break;
    case 5:
      preSharedKeyAuthenticationRequired
                ((QHttpThreadDelegate *)0x310c87,
                 (QSslPreSharedKeyAuthenticator *)in_stack_fffffffffffffd48);
      break;
    case 6:
      socketStartedConnecting((QHttpThreadDelegate *)0x310c99);
      break;
    case 7:
      requestSent((QHttpThreadDelegate *)0x310cab);
      break;
    case 8:
      _t1 = *(QHttpHeaders **)(in_RCX + 8);
      uVar4 = **(undefined4 **)(in_RCX + 0x10);
      uVar5 = *(undefined8 *)(in_RCX + 0x18);
      uVar3 = CONCAT13(**(undefined1 **)(in_RCX + 0x20),in_stack_fffffffffffffd8c);
      QSharedPointer<char>::QSharedPointer
                ((QSharedPointer<char> *)in_stack_fffffffffffffd50,
                 (QSharedPointer<char> *)in_stack_fffffffffffffd48);
      downloadMetaData((QHttpThreadDelegate *)CONCAT44(uVar4,in_stack_fffffffffffffda0),_t1,
                       (int)((ulong)uVar5 >> 0x20),in_RDI,SUB81((ulong)uVar5 >> 0x18,0),
                       (QSharedPointer<char> *)CONCAT44(uVar3,in_stack_fffffffffffffd88),
                       in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,
                       SUB81((ulong)uVar5 >> 0x10,0),SUB81((ulong)uVar5 >> 8,0));
      QSharedPointer<char>::~QSharedPointer((QSharedPointer<char> *)0x310db0);
      break;
    case 9:
      downloadProgress(in_stack_fffffffffffffd48,
                       CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                       (qint64)in_stack_fffffffffffffd50);
      break;
    case 10:
      downloadData(in_stack_fffffffffffffd50,(QByteArray *)in_stack_fffffffffffffd48);
      break;
    case 0xb:
      error(in_stack_fffffffffffffd50,in_stack_fffffffffffffd5c,(QString *)in_stack_fffffffffffffd48
           );
      break;
    case 0xc:
      downloadFinished((QHttpThreadDelegate *)0x310e3c);
      break;
    case 0xd:
      redirected(in_stack_fffffffffffffd50,(QUrl *)in_stack_fffffffffffffd48,
                 in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58);
      break;
    case 0xe:
      startRequest(in_stack_fffffffffffffe00);
      break;
    case 0xf:
      abortRequest(in_stack_fffffffffffffd50);
      break;
    case 0x10:
      readBufferSizeChanged(in_stack_fffffffffffffd50,(qint64)in_stack_fffffffffffffd48);
      break;
    case 0x11:
      readBufferFreed(in_stack_fffffffffffffd50,(qint64)in_stack_fffffffffffffd48);
      break;
    case 0x12:
      startRequestSynchronously(in_stack_fffffffffffffd70);
      break;
    case 0x13:
      readyReadSlot((QHttpThreadDelegate *)
                    CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      break;
    case 0x14:
      finishedSlot((QHttpThreadDelegate *)
                   CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      break;
    case 0x15:
      finishedWithErrorSlot
                ((QHttpThreadDelegate *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd5c,(QString *)in_stack_fffffffffffffd50);
      break;
    case 0x16:
      QString::QString((QString *)0x310f6f);
      finishedWithErrorSlot
                ((QHttpThreadDelegate *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd5c,(QString *)in_stack_fffffffffffffd50);
      QString::~QString((QString *)0x310f92);
      break;
    case 0x17:
      synchronousFinishedSlot
                ((QHttpThreadDelegate *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      break;
    case 0x18:
      synchronousFinishedWithErrorSlot
                ((QHttpThreadDelegate *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd5c,(QString *)in_stack_fffffffffffffd50);
      break;
    case 0x19:
      QString::QString((QString *)0x311001);
      synchronousFinishedWithErrorSlot
                ((QHttpThreadDelegate *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd5c,(QString *)in_stack_fffffffffffffd50);
      QString::~QString((QString *)0x311024);
      break;
    case 0x1a:
      headerChangedSlot(in_stack_fffffffffffffd98);
      break;
    case 0x1b:
      synchronousHeaderChangedSlot(in_stack_fffffffffffffd48);
      break;
    case 0x1c:
      dataReadProgressSlot
                ((QHttpThreadDelegate *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 (qint64)in_stack_fffffffffffffd50);
      break;
    case 0x1d:
      cacheCredentialsSlot
                ((QHttpThreadDelegate *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (QHttpNetworkRequest *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 (QAuthenticator *)in_stack_fffffffffffffd50);
      break;
    case 0x1e:
      encryptedSlot(in_stack_fffffffffffffd50);
      break;
    case 0x1f:
      sslErrorsSlot(in_stack_fffffffffffffd50,(QList<QSslError> *)in_stack_fffffffffffffd48);
      break;
    case 0x20:
      preSharedKeyAuthenticationRequiredSlot
                (in_stack_fffffffffffffd50,
                 (QSslPreSharedKeyAuthenticator *)in_stack_fffffffffffffd48);
      break;
    case 0x21:
      synchronousAuthenticationRequiredSlot
                (in_stack_fffffffffffffd68,
                 (QHttpNetworkRequest *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (QAuthenticator *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      break;
    case 0x22:
      synchronousProxyAuthenticationRequiredSlot
                ((QHttpThreadDelegate *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (QNetworkProxy *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 (QAuthenticator *)in_stack_fffffffffffffd50);
    }
  }
  if (in_ESI == 7) {
    switch(in_EDX) {
    case 0:
      if (**(int **)(in_RCX + 8) == 0) {
        local_68 = (QMetaTypeInterface *)QMetaType::fromType<QHttpNetworkRequest>();
        **(undefined8 **)in_RCX = local_68;
      }
      else {
        memset(&local_60,0,8);
        QMetaType::QMetaType(&local_60);
        **(undefined8 **)in_RCX = local_60.d_ptr;
      }
      break;
    case 1:
      if (**(int **)(in_RCX + 8) == 0) {
        local_78 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkProxy>();
        **(undefined8 **)in_RCX = local_78;
      }
      else {
        memset(&local_70,0,8);
        QMetaType::QMetaType(&local_70);
        **(undefined8 **)in_RCX = local_70.d_ptr;
      }
      break;
    default:
      memset(local_58,0,8);
      QMetaType::QMetaType(local_58);
      **(undefined8 **)in_RCX = local_58[0].d_ptr;
      break;
    case 3:
      if (**(int **)(in_RCX + 8) == 0) {
        local_88 = (QMetaTypeInterface *)QMetaType::fromType<QList<QSslError>>();
        **(undefined8 **)in_RCX = local_88;
      }
      else {
        memset(&local_80,0,8);
        QMetaType::QMetaType(&local_80);
        **(undefined8 **)in_RCX = local_80.d_ptr;
      }
      break;
    case 4:
      if (**(int **)(in_RCX + 8) == 0) {
        local_98 = (QMetaTypeInterface *)QMetaType::fromType<QSslConfiguration>();
        **(undefined8 **)in_RCX = local_98;
      }
      else {
        memset(&local_90,0,8);
        QMetaType::QMetaType(&local_90);
        **(undefined8 **)in_RCX = local_90.d_ptr;
      }
      break;
    case 5:
      if (**(int **)(in_RCX + 8) == 0) {
        local_a8 = (QMetaTypeInterface *)QMetaType::fromType<QSslPreSharedKeyAuthenticator*>();
        **(undefined8 **)in_RCX = local_a8;
      }
      else {
        memset(&local_a0,0,8);
        QMetaType::QMetaType(&local_a0);
        **(undefined8 **)in_RCX = local_a0.d_ptr;
      }
      break;
    case 0xb:
      if (**(int **)(in_RCX + 8) == 0) {
        local_b8 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = local_b8;
      }
      else {
        memset(&local_b0,0,8);
        QMetaType::QMetaType(&local_b0);
        **(undefined8 **)in_RCX = local_b0.d_ptr;
      }
      break;
    case 0x15:
      if (**(int **)(in_RCX + 8) == 0) {
        local_c8 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = local_c8;
      }
      else {
        memset(&local_c0,0,8);
        QMetaType::QMetaType(&local_c0);
        **(undefined8 **)in_RCX = local_c0.d_ptr;
      }
      break;
    case 0x16:
      if (**(int **)(in_RCX + 8) == 0) {
        local_d8 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = local_d8;
      }
      else {
        memset(&local_d0,0,8);
        QMetaType::QMetaType(&local_d0);
        **(undefined8 **)in_RCX = local_d0.d_ptr;
      }
      break;
    case 0x18:
      if (**(int **)(in_RCX + 8) == 0) {
        local_e8 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = local_e8;
      }
      else {
        memset(&local_e0,0,8);
        QMetaType::QMetaType(&local_e0);
        **(undefined8 **)in_RCX = local_e0.d_ptr;
      }
      break;
    case 0x19:
      if (**(int **)(in_RCX + 8) == 0) {
        local_f8 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = local_f8;
      }
      else {
        memset(&local_f0,0,8);
        QMetaType::QMetaType(&local_f0);
        **(undefined8 **)in_RCX = local_f0.d_ptr;
      }
      break;
    case 0x1d:
      if (**(int **)(in_RCX + 8) == 0) {
        local_108 = (QMetaTypeInterface *)QMetaType::fromType<QHttpNetworkRequest>();
        **(undefined8 **)in_RCX = local_108;
      }
      else {
        memset(&local_100,0,8);
        QMetaType::QMetaType(&local_100);
        **(undefined8 **)in_RCX = local_100.d_ptr;
      }
      break;
    case 0x1f:
      if (**(int **)(in_RCX + 8) == 0) {
        local_118 = (QMetaTypeInterface *)QMetaType::fromType<QList<QSslError>>();
        **(undefined8 **)in_RCX = local_118;
      }
      else {
        memset(&local_110,0,8);
        QMetaType::QMetaType(&local_110);
        **(undefined8 **)in_RCX = local_110.d_ptr;
      }
      break;
    case 0x20:
      if (**(int **)(in_RCX + 8) == 0) {
        local_128 = (QMetaTypeInterface *)QMetaType::fromType<QSslPreSharedKeyAuthenticator*>();
        **(undefined8 **)in_RCX = local_128;
      }
      else {
        memset(&local_120,0,8);
        QMetaType::QMetaType(&local_120);
        **(undefined8 **)in_RCX = local_120.d_ptr;
      }
      break;
    case 0x21:
      if (**(int **)(in_RCX + 8) == 0) {
        local_138 = (QMetaTypeInterface *)QMetaType::fromType<QHttpNetworkRequest>();
        **(undefined8 **)in_RCX = local_138;
      }
      else {
        memset(&local_130,0,8);
        QMetaType::QMetaType(&local_130);
        **(undefined8 **)in_RCX = local_130.d_ptr;
      }
      break;
    case 0x22:
      if (**(int **)(in_RCX + 8) == 0) {
        QVar2 = QMetaType::fromType<QNetworkProxy>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&local_140,0,8);
        QMetaType::QMetaType(&local_140);
        **(undefined8 **)in_RCX = local_140.d_ptr;
      }
    }
  }
  if (((((in_ESI == 5) &&
        (bVar1 = QtMocHelpers::
                 indexOfMethod<void(QHttpThreadDelegate::*)(QHttpNetworkRequest_const&,QAuthenticator*)>
                           (in_RCX,(void **)authenticationRequired,0,0), !bVar1)) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QHttpThreadDelegate::*)(QNetworkProxy_const&,QAuthenticator*)>
                          (in_RCX,(void **)proxyAuthenticationRequired,0,1), !bVar1)) &&
      ((((bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)()>
                            (in_RCX,(void **)encrypted,0,2), !bVar1 &&
         (bVar1 = QtMocHelpers::
                  indexOfMethod<void(QHttpThreadDelegate::*)(QList<QSslError>const&,bool*,QList<QSslError>*)>
                            (in_RCX,(void **)sslErrors,0,3), !bVar1)) &&
        ((bVar1 = QtMocHelpers::
                  indexOfMethod<void(QHttpThreadDelegate::*)(QSslConfiguration_const&)>
                            (in_RCX,(void **)sslConfigurationChanged,0,4), !bVar1 &&
         ((bVar1 = QtMocHelpers::
                   indexOfMethod<void(QHttpThreadDelegate::*)(QSslPreSharedKeyAuthenticator*)>
                             (in_RCX,(void **)preSharedKeyAuthenticationRequired,0,5), !bVar1 &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)()>
                             (in_RCX,(void **)socketStartedConnecting,0,6), !bVar1)))))) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)()>
                          (in_RCX,(void **)requestSent,0,7), !bVar1)))) &&
     ((((bVar1 = QtMocHelpers::
                 indexOfMethod<void(QHttpThreadDelegate::*)(QHttpHeaders_const&,int,QString_const&,bool,QSharedPointer<char>,long_long,long_long,bool,bool)>
                           (in_RCX,(void **)downloadMetaData,0,8), !bVar1 &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)(long_long,long_long)>
                           (in_RCX,(void **)downloadProgress,0,9), !bVar1)) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)(QByteArray_const&)>
                          (in_RCX,(void **)downloadData,0,10), !bVar1)) &&
      ((bVar1 = QtMocHelpers::
                indexOfMethod<void(QHttpThreadDelegate::*)(QNetworkReply::NetworkError,QString_const&)>
                          (in_RCX,(void **)error,0,0xb), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)()>
                          (in_RCX,(void **)downloadFinished,0,0xc), !bVar1)))))) {
    QtMocHelpers::indexOfMethod<void(QHttpThreadDelegate::*)(QUrl_const&,int,int)>
              (in_RCX,(void **)redirected,0,0xd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpThreadDelegate *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 1: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 2: _t->encrypted(); break;
        case 3: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool*>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>*>>(_a[3]))); break;
        case 4: _t->sslConfigurationChanged((*reinterpret_cast< std::add_pointer_t<QSslConfiguration>>(_a[1]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 6: _t->socketStartedConnecting(); break;
        case 7: _t->requestSent(); break;
        case 8: _t->downloadMetaData((*reinterpret_cast< std::add_pointer_t<QHttpHeaders>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<QSharedPointer<char>>>(_a[5])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[6])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[7])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[8])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[9]))); break;
        case 9: _t->downloadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 10: _t->downloadData((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1]))); break;
        case 11: _t->error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 12: _t->downloadFinished(); break;
        case 13: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->startRequest(); break;
        case 15: _t->abortRequest(); break;
        case 16: _t->readBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 17: _t->readBufferFreed((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 18: _t->startRequestSynchronously(); break;
        case 19: _t->readyReadSlot(); break;
        case 20: _t->finishedSlot(); break;
        case 21: _t->finishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 22: _t->finishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 23: _t->synchronousFinishedSlot(); break;
        case 24: _t->synchronousFinishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 25: _t->synchronousFinishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 26: _t->headerChangedSlot(); break;
        case 27: _t->synchronousHeaderChangedSlot(); break;
        case 28: _t->dataReadProgressSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 29: _t->cacheCredentialsSlot((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 30: _t->encryptedSlot(); break;
        case 31: _t->sslErrorsSlot((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 32: _t->preSharedKeyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 33: _t->synchronousAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 34: _t->synchronousProxyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslConfiguration >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 11:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 22:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 24:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 25:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 29:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 31:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 32:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 33:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 34:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpThreadDelegate::authenticationRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QHttpThreadDelegate::proxyAuthenticationRequired, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::encrypted, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QList<QSslError> & , bool * , QList<QSslError> * )>(_a, &QHttpThreadDelegate::sslErrors, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QSslConfiguration & )>(_a, &QHttpThreadDelegate::sslConfigurationChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QHttpThreadDelegate::preSharedKeyAuthenticationRequired, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::socketStartedConnecting, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::requestSent, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QHttpHeaders & , int , const QString & , bool , QSharedPointer<char> , qint64 , qint64 , bool , bool )>(_a, &QHttpThreadDelegate::downloadMetaData, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(qint64 , qint64 )>(_a, &QHttpThreadDelegate::downloadProgress, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QByteArray & )>(_a, &QHttpThreadDelegate::downloadData, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QHttpThreadDelegate::error, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::downloadFinished, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QUrl & , int , int )>(_a, &QHttpThreadDelegate::redirected, 13))
            return;
    }
}